

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<double>::apply
          (QGate2<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  int qubit0;
  reference pvVar1;
  double *vector_00;
  SquareMatrix<double> local_d8;
  undefined1 local_c8 [8];
  anon_class_136_17_7d744f41 f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<double,_std::allocator<double>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate2<double> *this_local;
  
  (*(this->super_QObject<double>)._vptr_QObject[5])();
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,0);
  *pvVar1 = *pvVar1 + offset;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,1);
  *pvVar1 = *pvVar1 + offset;
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_d8);
  vector_00 = std::vector<double,_std::allocator<double>_>::data(vector);
  lambda_QGate2<double>((anon_class_136_17_7d744f41 *)local_c8,op,&local_d8,vector_00);
  dense::SquareMatrix<double>::~SquareMatrix(&local_d8);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,0);
  qubit0 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f.m44,1);
  apply4<qclab::qgates::lambda_QGate2<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,qubit0,*pvVar1,(anon_class_136_17_7d744f41 *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&f.m44);
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }